

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

bool Path::get_mtime_us(string *path,uint64_t *mtime_us)

{
  int iVar1;
  stat s;
  stat sStack_a8;
  
  memset(&sStack_a8,0,0x90);
  iVar1 = stat((path->_M_dataplus)._M_p,&sStack_a8);
  if (iVar1 == 0) {
    *mtime_us = sStack_a8.st_mtim.tv_nsec / 1000 + sStack_a8.st_mtim.tv_sec * 1000000;
  }
  return iVar1 == 0;
}

Assistant:

bool get_mtime_us(const std::string &path, uint64_t &mtime_us)
{
#ifdef _WIN32
	HANDLE h = CreateFileA(path.c_str(), GENERIC_READ, FILE_SHARE_READ,
	                       nullptr, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL,
	                       INVALID_HANDLE_VALUE);
	if (h == INVALID_HANDLE_VALUE)
		return false;

	FILETIME ft;
	if (!GetFileTime(h, nullptr, nullptr, &ft))
	{
		CloseHandle(h);
		return false;
	}

	mtime_us = ((uint64_t(ft.dwHighDateTime) << 32) | uint64_t(ft.dwLowDateTime)) / 10;
	CloseHandle(h);
	return true;
#else
	struct stat s = {};
	if (::stat(path.c_str(), &s) != 0)
		return false;
#if defined(__linux__)
	mtime_us = s.st_mtim.tv_sec * 1000000ll + s.st_mtim.tv_nsec / 1000;
#else
	// Fallback.
	mtime_us = s.st_mtime * 1000000ll;
#endif
	return true;
#endif
}